

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::StoreVersionFound(cmFindPackageCommand *this)

{
  ulong uVar1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_c0;
  anon_class_8_1_8991fb9c local_a0;
  anon_class_8_1_8991fb9c addDefinition;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string ver;
  cmFindPackageCommand *this_local;
  
  ver.field_2._8_8_ = this;
  cmAlphaNum::cmAlphaNum(&local_68,&this->Name);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&addDefinition,"_VERSION");
  cmStrCat<>((string *)local_38,&local_68,(cmAlphaNum *)&addDefinition);
  local_a0.this = this;
  std::
  function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>::
  function<cmFindPackageCommand::StoreVersionFound()::__0&,void>
            ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_c0,&local_a0);
  SetVersionVariables(this,&local_c0,(string *)local_38,&this->VersionFound,this->VersionFoundCount,
                      this->VersionFoundMajor,this->VersionFoundMinor,this->VersionFoundPatch,
                      this->VersionFoundTweak);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function(&local_c0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).Makefile,(string *)local_38);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmFindPackageCommand::StoreVersionFound()
{
  // Store the whole version string.
  std::string const ver = cmStrCat(this->Name, "_VERSION");
  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->Makefile->AddDefinition(variable, value);
  };

  this->SetVersionVariables(addDefinition, ver, this->VersionFound,
                            this->VersionFoundCount, this->VersionFoundMajor,
                            this->VersionFoundMinor, this->VersionFoundPatch,
                            this->VersionFoundTweak);

  if (this->VersionFound.empty()) {
    this->Makefile->RemoveDefinition(ver);
  }
}